

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O2

void Sbd_ManUpdateOrder(Sbd_Man_t *p,int Pivot)

{
  Vec_Wec_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar6;
  undefined8 extraout_RDX_03;
  int i;
  int iVar7;
  uint uVar8;
  uint uVar9;
  
  iVar2 = Vec_IntEntry(p->vLutLevs,Pivot);
  pVVar1 = p->vDivLevels;
  for (iVar7 = 0; iVar7 < pVVar1->nSize; iVar7 = iVar7 + 1) {
    pVVar5 = Vec_WecEntry(pVVar1,iVar7);
    pVVar5->nSize = 0;
  }
  pVVar1->nSize = 0;
  pVVar1 = p->vDivLevels;
  Vec_WecGrow(pVVar1,iVar2 + 1);
  pVVar1->nSize = iVar2 + 1;
  uVar6 = extraout_RDX;
  for (iVar7 = 0; pVVar5 = p->vWinObjs, iVar7 < pVVar5->nSize; iVar7 = iVar7 + 1) {
    iVar3 = Vec_IntEntry(pVVar5,iVar7);
    pVVar1 = p->vDivLevels;
    iVar4 = Vec_IntEntry(p->vLutLevs,iVar3);
    Vec_WecPush(pVVar1,iVar4,iVar3);
    uVar6 = extraout_RDX_00;
  }
  pVVar5->nSize = 0;
  uVar9 = 0;
  for (iVar7 = 0; iVar7 < p->vDivLevels->nSize; iVar7 = iVar7 + 1) {
    pVVar5 = Vec_WecEntry(p->vDivLevels,iVar7);
    qsort(pVVar5->pArray,(long)pVVar5->nSize,4,Vec_IntSortCompare1);
    uVar6 = extraout_RDX_01;
    for (iVar3 = 0; iVar3 < pVVar5->nSize; iVar3 = iVar3 + 1) {
      iVar4 = Vec_IntEntry(pVVar5,iVar3);
      Vec_IntWriteEntry(p->vObj2Var,iVar4,p->vWinObjs->nSize);
      Vec_IntPush(p->vWinObjs,iVar4);
      uVar6 = extraout_RDX_02;
    }
    if (iVar7 == iVar2 + -2) {
      uVar9 = p->vWinObjs->nSize;
    }
  }
  if (0 < (int)uVar9) {
    p->vDivVars->nSize = 0;
    p->DivCutoff = -1;
    uVar8 = 0x3f;
    if (0x3f < uVar9) {
      uVar8 = uVar9;
    }
    for (iVar7 = uVar8 - 0x3f; iVar7 < (int)uVar9; iVar7 = iVar7 + 1) {
      iVar3 = Vec_IntEntry(p->vWinObjs,iVar7);
      if (p->DivCutoff == -1) {
        iVar3 = Vec_IntEntry(p->vLutLevs,iVar3);
        pVVar5 = p->vDivVars;
        if (iVar3 == iVar2 + -2) {
          p->DivCutoff = pVVar5->nSize;
        }
      }
      else {
        pVVar5 = p->vDivVars;
      }
      Vec_IntPush(pVVar5,iVar7);
      uVar6 = extraout_RDX_03;
    }
    if (p->DivCutoff == -1) {
      p->DivCutoff = 0;
    }
    Vec_IntFill(p->vDivValues,p->vDivVars->nSize,(int)uVar6);
    return;
  }
  __assert_fail("nTimeValidDivs > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                ,0x16d,"void Sbd_ManUpdateOrder(Sbd_Man_t *, int)");
}

Assistant:

void Sbd_ManUpdateOrder( Sbd_Man_t * p, int Pivot )
{
    int i, k, Node;
    Vec_Int_t * vLevel;
    int nTimeValidDivs = 0;
    // collect divisors by logic level
    int LevelMax = Vec_IntEntry(p->vLutLevs, Pivot);
    Vec_WecClear( p->vDivLevels );
    Vec_WecInit( p->vDivLevels, LevelMax + 1 );
    Vec_IntForEachEntry( p->vWinObjs, Node, i )
        Vec_WecPush( p->vDivLevels, Vec_IntEntry(p->vLutLevs, Node), Node );
    // reload divisors
    Vec_IntClear( p->vWinObjs );
    Vec_WecForEachLevel( p->vDivLevels, vLevel, i )
    {
        Vec_IntSort( vLevel, 0 );
        Vec_IntForEachEntry( vLevel, Node, k )
        {
            Vec_IntWriteEntry( p->vObj2Var, Node, Vec_IntSize(p->vWinObjs) );
            Vec_IntPush( p->vWinObjs, Node );
        }
        // remember divisor cutoff
        if ( i == LevelMax - 2 )
            nTimeValidDivs = Vec_IntSize(p->vWinObjs);
    }
    assert( nTimeValidDivs > 0 );
    Vec_IntClear( p->vDivVars );
    p->DivCutoff = -1;
    Vec_IntForEachEntryStartStop( p->vWinObjs, Node, i, Abc_MaxInt(0, nTimeValidDivs-63), nTimeValidDivs )
    {
        if ( p->DivCutoff == -1 && Vec_IntEntry(p->vLutLevs, Node) == LevelMax - 2 )
            p->DivCutoff = Vec_IntSize(p->vDivVars);
        Vec_IntPush( p->vDivVars, i );
    }
    if ( p->DivCutoff == -1 )
        p->DivCutoff = 0;
    // verify
/*
    assert( Vec_IntSize(p->vDivVars) < 64 );
    Vec_IntForEachEntryStart( p->vDivVars, Node, i, p->DivCutoff )
        assert( Vec_IntEntry(p->vLutLevs, Vec_IntEntry(p->vWinObjs, Node)) == LevelMax - 2 );
    Vec_IntForEachEntryStop( p->vDivVars, Node, i, p->DivCutoff )
        assert( Vec_IntEntry(p->vLutLevs, Vec_IntEntry(p->vWinObjs, Node)) < LevelMax - 2 );
*/
    Vec_IntFill( p->vDivValues, Vec_IntSize(p->vDivVars), 0 );
    //printf( "%d ", Vec_IntSize(p->vDivVars) );
//    printf( "Node %4d :  Win = %5d.   Divs = %5d.    D1 = %5d.  D2 = %5d.\n",  
//        Pivot, Vec_IntSize(p->vWinObjs), Vec_IntSize(p->vDivVars), Vec_IntSize(p->vDivVars)-p->DivCutoff, p->DivCutoff );
}